

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayedObjects.hpp
# Opt level: O1

bool __thiscall
gmlc::concurrency::
DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
isRecognized(DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *this,string *name)

{
  int iVar1;
  iterator iVar2;
  bool bVar3;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->promiseLock);
  if (iVar1 == 0) {
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::find(&(this->promiseByString)._M_t,name);
    bVar3 = true;
    if ((_Rb_tree_header *)iVar2._M_node ==
        &(this->promiseByString)._M_t._M_impl.super__Rb_tree_header) {
      iVar2 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::find(&(this->usedPromiseByString)._M_t,name);
      bVar3 = (_Rb_tree_header *)iVar2._M_node !=
              &(this->usedPromiseByString)._M_t._M_impl.super__Rb_tree_header;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->promiseLock);
    return bVar3;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

bool isRecognized(const std::string& name)
    {
        std::lock_guard<std::mutex> lock(promiseLock);
        auto fnd = promiseByString.find(name);
        if (fnd != promiseByString.end()) {
            return true;
        }
        auto fnd2 = usedPromiseByString.find(name);
        if (fnd2 != usedPromiseByString.end()) {
            return true;
        }
        return false;
    }